

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall Lowerer::LowerRemR8(Lowerer *this,Instr *instr)

{
  LowererMD *this_00;
  Func *func;
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  undefined4 *puVar4;
  JITTimeFunctionBody *this_01;
  Opnd *pOVar5;
  HelperCallOpnd *this_02;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6b2d,"(instr)","instr");
    if (!bVar2) goto LAB_005aa0eb;
    *puVar4 = 0;
  }
  if (instr->m_opcode != Rem_A) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6b2e,"(instr->m_opcode == Js::OpCode::Rem_A)",
                       "instr->m_opcode == Js::OpCode::Rem_A");
    if (!bVar2) goto LAB_005aa0eb;
    *puVar4 = 0;
  }
  this_01 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  bVar2 = JITTimeFunctionBody::IsAsmJsMode(this_01);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6b2f,"(m_func->GetJITFunctionBody()->IsAsmJsMode())",
                       "m_func->GetJITFunctionBody()->IsAsmJsMode()");
    if (!bVar2) goto LAB_005aa0eb;
    *puVar4 = 0;
  }
  this_00 = &this->m_lowererMD;
  pOVar5 = IR::Instr::UnlinkSrc2(instr);
  LowererMD::LoadDoubleHelperArgument(this_00,instr,pOVar5);
  pOVar5 = IR::Instr::UnlinkSrc1(instr);
  LowererMD::LoadDoubleHelperArgument(this_00,instr,pOVar5);
  this_02 = IR::HelperCallOpnd::New(HelperOp_Rem_Double,this->m_func);
  if (instr->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar2) goto LAB_005aa0eb;
    *puVar4 = 0;
  }
  func = instr->m_func;
  if ((this_02->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar2) {
LAB_005aa0eb:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  bVar3 = (this_02->super_Opnd).field_0xb;
  if ((bVar3 & 2) != 0) {
    this_02 = (HelperCallOpnd *)IR::Opnd::Copy(&this_02->super_Opnd,func);
    bVar3 = (this_02->super_Opnd).field_0xb;
  }
  (this_02->super_Opnd).field_0xb = bVar3 | 2;
  instr->m_src1 = &this_02->super_Opnd;
  LowererMD::LowerCall(this_00,instr,0);
  return;
}

Assistant:

void
Lowerer::LowerRemR8(IR::Instr * instr)
{
    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::Rem_A);
    Assert(m_func->GetJITFunctionBody()->IsAsmJsMode());

    m_lowererMD.LoadDoubleHelperArgument(instr, instr->UnlinkSrc2());
    m_lowererMD.LoadDoubleHelperArgument(instr, instr->UnlinkSrc1());
    instr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperOp_Rem_Double, m_func));
    m_lowererMD.LowerCall(instr, 0);
}